

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_ec_asn1.cc
# Opt level: O2

int ec_copy_parameters(EVP_PKEY *to,EVP_PKEY *from)

{
  int iVar1;
  EC_GROUP *group;
  EC_KEY *key;
  int line;
  
  if ((EC_KEY *)from->pkey == (EC_KEY *)0x0) {
    iVar1 = 0x78;
    line = 0xb3;
  }
  else {
    group = EC_KEY_get0_group((EC_KEY *)from->pkey);
    if (group != (EC_GROUP *)0x0) {
      key = (EC_KEY *)to->pkey;
      if (key == (EC_KEY *)0x0) {
        key = EC_KEY_new();
        to->pkey = key;
        if (key == (EC_KEY *)0x0) {
          return 0;
        }
      }
      iVar1 = EC_KEY_set_group(key,group);
      return iVar1;
    }
    iVar1 = 0x76;
    line = 0xb8;
  }
  ERR_put_error(6,0,iVar1,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/p_ec_asn1.cc"
                ,line);
  return 0;
}

Assistant:

static int ec_copy_parameters(EVP_PKEY *to, const EVP_PKEY *from) {
  const EC_KEY *from_key = reinterpret_cast<const EC_KEY *>(from->pkey);
  if (from_key == NULL) {
    OPENSSL_PUT_ERROR(EVP, EVP_R_NO_KEY_SET);
    return 0;
  }
  const EC_GROUP *group = EC_KEY_get0_group(from_key);
  if (group == NULL) {
    OPENSSL_PUT_ERROR(EVP, EVP_R_MISSING_PARAMETERS);
    return 0;
  }
  if (to->pkey == NULL) {
    to->pkey = EC_KEY_new();
    if (to->pkey == NULL) {
      return 0;
    }
  }
  return EC_KEY_set_group(reinterpret_cast<EC_KEY *>(to->pkey), group);
}